

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void CollectMergedSet(VmInstruction *inst,uint marker,SmallArray<VmInstruction_*,_32U> *mergedSet)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  VmInstruction *source_1;
  VmInstruction *destination_1;
  uint argumentPos_1;
  VmInstruction *instruction_3;
  uint userPos_1;
  VmInstruction *source;
  VmInstruction *destination;
  uint argumentPos;
  VmInstruction *instruction_2;
  uint userPos;
  VmInstruction *instruction_1;
  VmInstruction *instruction;
  uint argument;
  SmallArray<VmInstruction_*,_32U> *mergedSet_local;
  VmInstruction *pVStack_10;
  uint marker_local;
  VmInstruction *inst_local;
  
  if (inst->marker == 0) {
    pVStack_10 = inst;
    SmallArray<VmInstruction_*,_32U>::push_back(mergedSet,&stack0xfffffffffffffff0);
    pVStack_10->marker = marker;
    if (pVStack_10->cmd == VM_INST_PHI) {
      for (instruction._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVStack_10->arguments),
          instruction._4_4_ < uVar1; instruction._4_4_ = instruction._4_4_ + 2) {
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_10->arguments,instruction._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        CollectMergedSet(pVVar3,marker,mergedSet);
      }
    }
    if (pVStack_10->cmd == VM_INST_MOV) {
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_10->arguments,0);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      CollectMergedSet(pVVar3,marker,mergedSet);
    }
    if (pVStack_10->cmd == VM_INST_DEF) {
      for (instruction_2._4_4_ = 0;
          uVar1 = SmallArray<VmValue_*,_8U>::size(&(pVStack_10->super_VmValue).users),
          instruction_2._4_4_ < uVar1; instruction_2._4_4_ = instruction_2._4_4_ + 1) {
        ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(pVStack_10->super_VmValue).users,instruction_2._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        if ((pVVar3 != (VmInstruction *)0x0) && (pVVar3->cmd == VM_INST_PARALLEL_COPY)) {
          for (destination._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
              destination._4_4_ < uVar1; destination._4_4_ = destination._4_4_ + 2) {
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination._4_4_);
            pVVar4 = getType<VmInstruction>(*ppVVar2);
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                (&pVVar3->arguments,destination._4_4_ + 1);
            pVVar5 = getType<VmInstruction>(*ppVVar2);
            if (pVVar4 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c46,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
            if (pVVar5 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1c47,
                            "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                           );
            }
            if (pVStack_10 == pVVar4) {
              CollectMergedSet(pVVar5,marker,mergedSet);
            }
          }
        }
      }
    }
    for (instruction_3._4_4_ = 0;
        uVar1 = SmallArray<VmValue_*,_8U>::size(&(pVStack_10->super_VmValue).users),
        instruction_3._4_4_ < uVar1; instruction_3._4_4_ = instruction_3._4_4_ + 1) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                          (&(pVStack_10->super_VmValue).users,instruction_3._4_4_);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if (pVVar3->cmd == VM_INST_PHI) {
        CollectMergedSet(pVVar3,marker,mergedSet);
      }
      if (pVVar3->cmd == VM_INST_MOV) {
        CollectMergedSet(pVVar3,marker,mergedSet);
      }
      if (pVVar3->cmd == VM_INST_PARALLEL_COPY) {
        for (destination_1._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
            destination_1._4_4_ < uVar1; destination_1._4_4_ = destination_1._4_4_ + 2) {
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination_1._4_4_);
          pVVar4 = getType<VmInstruction>(*ppVVar2);
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                              (&pVVar3->arguments,destination_1._4_4_ + 1);
          pVVar5 = getType<VmInstruction>(*ppVVar2);
          if (pVVar4 == (VmInstruction *)0x0) {
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1c61,
                          "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                         );
          }
          if (pVVar5 == (VmInstruction *)0x0) {
            __assert_fail("source",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1c62,
                          "void CollectMergedSet(VmInstruction *, unsigned int, SmallArray<VmInstruction *, 32> &)"
                         );
          }
          if (pVStack_10 == pVVar5) {
            CollectMergedSet(pVVar4,marker,mergedSet);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CollectMergedSet(VmInstruction *inst, unsigned marker, SmallArray<VmInstruction*, 32> &mergedSet)
{
	if(inst->marker != 0)
		return;

	mergedSet.push_back(inst);

	inst->marker = marker;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			CollectMergedSet(instruction, marker, mergedSet);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		CollectMergedSet(instruction, marker, mergedSet);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						CollectMergedSet(source, marker, mergedSet);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_MOV)
			CollectMergedSet(instruction, marker, mergedSet);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					CollectMergedSet(destination, marker, mergedSet);
			}
		}
	}
}